

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsf.c
# Opt level: O0

void Qiniu_RSF_ListRet_Cleanup(Qiniu_RSF_ListRet *self)

{
  Qiniu_RSF_ListRet *self_local;
  
  if (self->items != (_Qiniu_RSF_ListItem *)0x0) {
    Qiniu_FreeV2(&self->items);
    self->itemsCount = 0;
  }
  if (self->commonPrefixes != (char **)0x0) {
    Qiniu_FreeV2(&self->commonPrefixes);
    self->commonPrefixesCount = 0;
  }
  return;
}

Assistant:

void Qiniu_RSF_ListRet_Cleanup(Qiniu_RSF_ListRet *self)
{
    if (self->items != NULL)
    {
        Qiniu_FreeV2((void **)&self->items);
        self->itemsCount = 0;
    }
    if (self->commonPrefixes != NULL)
    {
        Qiniu_FreeV2((void **)&self->commonPrefixes);
        self->commonPrefixesCount = 0;
    }
}